

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_tests.cpp
# Opt level: O0

void BasicTests::brandaoTest(string *input_file)

{
  time_t tVar1;
  long lVar2;
  string local_90 [32];
  undefined8 local_70;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  undefined8 local_48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  undefined8 local_38;
  string local_30 [8];
  string savename;
  string *input_file_local;
  
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  std::__cxx11::string::string(local_30,(string *)input_file);
  local_40._M_current = (char *)std::__cxx11::string::begin();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_38,&local_40);
  local_58._M_current = (char *)std::__cxx11::string::begin();
  local_50 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator+(&local_58,7);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_48,&local_50);
  local_70 = std::__cxx11::string::erase(local_30,local_38,local_48);
  lVar2 = std::__cxx11::string::length();
  std::__cxx11::string::length();
  std::__cxx11::string::erase((ulong)local_30,lVar2 - 2);
  std::__cxx11::string::string(local_90,local_30);
  Capacitor_Test_GA((string *)local_90);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void BasicTests::brandaoTest(string input_file) {
    srand(time(NULL));

    string savename = input_file;
    savename.erase(savename.begin(), savename.begin() + 7);
    savename.erase(savename.length() - 2, savename.length() - 1);

//    testeEntradas(savename);//perda total e tensao minima para cada configuration para compara com a tese do leonardo willer

//    Capacitor_Test_Ivo(savename);
    Capacitor_Test_GA(savename);
}